

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::IsEnumNamespaceMessage
          (DescriptorBuilder *this,EnumDescriptor *enm)

{
  bool bVar1;
  FeatureSet_VisibilityFeature_DefaultSymbolVisibility FVar2;
  SymbolVisibility SVar3;
  int iVar4;
  Descriptor *this_00;
  FeatureSet *this_01;
  Descriptor *pDVar5;
  ReservedRange *pRVar6;
  bool local_39;
  ReservedRange *range;
  bool is_local;
  bool default_to_local;
  DefaultSymbolVisibility default_visibility;
  Descriptor *container;
  EnumDescriptor *enm_local;
  DescriptorBuilder *this_local;
  
  this_00 = EnumDescriptor::containing_type(enm);
  this_01 = EnumDescriptor::features(enm);
  FVar2 = FeatureSet::default_symbol_visibility(this_01);
  pDVar5 = Descriptor::containing_type(this_00);
  if (pDVar5 == (Descriptor *)0x0) {
    local_39 = FVar2 == FeatureSet_VisibilityFeature_DefaultSymbolVisibility_STRICT ||
               FVar2 == FeatureSet_VisibilityFeature_DefaultSymbolVisibility_LOCAL_ALL;
    SVar3 = Descriptor::visibility_keyword(this_00);
    bVar1 = true;
    if (SVar3 != VISIBILITY_LOCAL) {
      SVar3 = Descriptor::visibility_keyword(this_00);
      bVar1 = false;
      if (SVar3 == VISIBILITY_UNSET) {
        bVar1 = local_39;
      }
    }
    if (bVar1) {
      iVar4 = Descriptor::reserved_range_count(this_00);
      if (iVar4 == 1) {
        pRVar6 = Descriptor::reserved_range(this_00,0);
        if ((pRVar6 == (ReservedRange *)0x0) || ((pRVar6->start != 1 && (pRVar6->end != 19999)))) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorBuilder::IsEnumNamespaceMessage(
    const EnumDescriptor& enm) const {
  const Descriptor* container = enm.containing_type();
  const FeatureSet::VisibilityFeature::DefaultSymbolVisibility
      default_visibility = enm.features().default_symbol_visibility();
  // Only allowed for top-level messages
  if (container->containing_type() != nullptr) {
    return false;
  }

  bool default_to_local =
      default_visibility == FeatureSet::VisibilityFeature::STRICT ||
      default_visibility == FeatureSet::VisibilityFeature::LOCAL_ALL;

  bool is_local =
      container->visibility_keyword() == SymbolVisibility::VISIBILITY_LOCAL ||
      (container->visibility_keyword() == SymbolVisibility::VISIBILITY_UNSET &&
       default_to_local);

  // must either be marked local, or unset with file default making it local
  if (!is_local) {
    return false;
  }

  if (container->reserved_range_count() != 1) {
    return false;
  }

  const Descriptor::ReservedRange* range = container->reserved_range(0);
  if (range == nullptr ||
      (range->start != 1 &&
       range->end != FieldDescriptor::kLastReservedNumber)) {
    return false;
  }

  return true;
}